

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateHeader
          (Generator *this,GeneratorOptions *options,FileDescriptor *file,Printer *printer)

{
  if (file != (FileDescriptor *)0x0) {
    io::Printer::Print<char[9],std::__cxx11::string>
              (printer,"// source: $filename$\n",(char (*) [9])"filename",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
  }
  io::Printer::Print<>
            (printer,
             "/**\n * @fileoverview\n * @enhanceable\n * @suppress {messageConventions} JS Compiler reports an error if a variable or\n *     field starts with \'MSG_\' and isn\'t a translatable message.\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
            );
  return;
}

Assistant:

void Generator::GenerateHeader(const GeneratorOptions& options,
                               const FileDescriptor* file,
                               io::Printer* printer) const {
  if (file != nullptr) {
    printer->Print("// source: $filename$\n", "filename", file->name());
  }
  printer->Print(
      "/**\n"
      " * @fileoverview\n"
      " * @enhanceable\n"
      " * @suppress {messageConventions} JS Compiler reports an "
      "error if a variable or\n"
      " *     field starts with 'MSG_' and isn't a translatable "
      "message.\n"
      " * @public\n"
      " */\n"
      "// GENERATED CODE -- DO NOT EDIT!\n"
      "\n");
}